

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O0

void __thiscall
kj::_::anon_unknown_0::MockExceptionCallback::onFatalException
          (MockExceptionCallback *this,Exception *exception)

{
  char *pcVar1;
  char *__first;
  undefined8 uVar2;
  Exception *params;
  char *end;
  String what;
  Exception *exception_local;
  MockExceptionCallback *this_local;
  
  what.content.disposer = (ArrayDisposer *)exception;
  ::std::__cxx11::string::operator+=((string *)&this->text,"fatal exception: ");
  str<kj::Exception&>((String *)&end,(kj *)what.content.disposer,params);
  pcVar1 = String::cStr((String *)&end);
  pcVar1 = strstr(pcVar1,"\nstack: ");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = String::cStr((String *)&end);
    ::std::__cxx11::string::operator+=((string *)&this->text,pcVar1);
  }
  else {
    __first = String::cStr((String *)&end);
    ::std::__cxx11::string::append<char_const*,void>((string *)&this->text,__first,pcVar1);
  }
  ::std::__cxx11::string::operator+=((string *)&this->text,'\n');
  flush(this);
  uVar2 = __cxa_allocate_exception(1);
  __cxa_throw(uVar2,&(anonymous_namespace)::MockException::typeinfo,0);
}

Assistant:

void onFatalException(Exception&& exception) override {
    text += "fatal exception: ";
    auto what = str(exception);
    // Discard the stack trace.
    const char* end = strstr(what.cStr(), "\nstack: ");
    if (end == nullptr) {
      text += what.cStr();
    } else {
      text.append(what.cStr(), end);
    }
    text += '\n';
    flush();
#if KJ_NO_EXCEPTIONS
    if (outputPipe >= 0) {
      // This is a child process.  We got what we want, now exit quickly without writing any
      // additional messages, with a status code that the parent will interpret as "exited in the
      // way we expected".
      _exit(74);
    }
#else
    throw MockException();
#endif
  }